

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
          (SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
           *this,NoCheckHeapAllocator *allocator,RangeUnit<Js::SourceFunctionNode> *data)

{
  Type_conflict pSVar1;
  SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *pSVar2;
  NoCheckHeapAllocator *alloc;
  SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *this_00;
  Type_conflict *ppSVar3;
  TrackAllocData local_58;
  SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *local_30;
  Node *newNode;
  RangeUnit<Js::SourceFunctionNode> *data_local;
  NoCheckHeapAllocator *allocator_local;
  SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
  *this_local;
  
  newNode = (Node *)data;
  data_local = (RangeUnit<Js::SourceFunctionNode> *)allocator;
  allocator_local = (NoCheckHeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo(allocator,&local_58);
  this_00 = (SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *)
            new<Memory::NoCheckHeapAllocator>(0x18,alloc,0x3d5f00);
  SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator>::
  SListNode<Js::RangeUnit<Js::SourceFunctionNode>>
            (this_00,(RangeUnit<Js::SourceFunctionNode> *)newNode);
  if (this_00 !=
      (SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *)0x0) {
    local_30 = this_00;
    ppSVar3 = SListNodeBase<Memory::NoCheckHeapAllocator>::Next
                        (&this->super_SListNodeBase<Memory::NoCheckHeapAllocator>);
    pSVar1 = *ppSVar3;
    ppSVar3 = SListNodeBase<Memory::NoCheckHeapAllocator>::Next
                        ((SListNodeBase<Memory::NoCheckHeapAllocator> *)local_30);
    pSVar2 = local_30;
    *ppSVar3 = pSVar1;
    ppSVar3 = SListNodeBase<Memory::NoCheckHeapAllocator>::Next
                        (&this->super_SListNodeBase<Memory::NoCheckHeapAllocator>);
    *ppSVar3 = (Type_conflict)pSVar2;
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 !=
         (SListNode<Js::RangeUnit<Js::SourceFunctionNode>,Memory::NoCheckHeapAllocator> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }